

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O0

void test_bson_corrupt_utf8(void)

{
  byte bVar1;
  int __fd;
  ssize_t sVar2;
  long lVar3;
  ssize_t r;
  int fd;
  char *str;
  size_t buflen;
  bson_t b;
  uint8_t *buf;
  undefined1 local_180 [232];
  void *local_98;
  
  local_98 = (void *)bson_malloc0(0x400);
  __fd = open("/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/test56.bson"
              ,0);
  if (__fd == -1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x2d4,"test_bson_corrupt_utf8","-1 != fd");
    abort();
  }
  sVar2 = read(__fd,local_98,0x400);
  if (sVar2 != 0x2a) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x2d7,"test_bson_corrupt_utf8","r == 42");
    abort();
  }
  bVar1 = bson_init_static(local_180,local_98,0x2a);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x2da,"test_bson_corrupt_utf8","r");
    abort();
  }
  lVar3 = bson_as_json(local_180,0);
  if (lVar3 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x2dd,"test_bson_corrupt_utf8","!str");
    abort();
  }
  bson_destroy(local_180);
  bson_free(local_98);
  return;
}

Assistant:

static void
test_bson_corrupt_utf8 (void)
{
   uint8_t *buf;
   bson_t b;
   size_t buflen = 1024;
   char *str;
   int fd;
   ssize_t r;

   buf = bson_malloc0 (buflen);

   fd = bson_open (BINARY_DIR "/test56.bson", O_RDONLY);
   BSON_ASSERT (-1 != fd);

   r = bson_read (fd, buf, buflen);
   BSON_ASSERT (r == 42);

   r = bson_init_static (&b, buf, (uint32_t) r);
   BSON_ASSERT (r);

   str = bson_as_json (&b, NULL);
   BSON_ASSERT (!str);

   bson_destroy (&b);
   bson_free (buf);
}